

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::populateBoard(Board *this,ifstream *dataFile)

{
  Block block;
  int id_00;
  bool bVar1;
  istream *piVar2;
  undefined1 local_54 [16];
  int local_44;
  undefined1 local_40 [8];
  Block tempBlock;
  int iStack_24;
  char direction;
  int id;
  int length;
  int column;
  int row;
  ifstream *dataFile_local;
  Board *this_local;
  
  tempBlock.direction = 1;
  _column = dataFile;
  dataFile_local = (ifstream *)this;
  Block::Block((Block *)local_40);
  while( true ) {
    piVar2 = (istream *)std::istream::operator>>((istream *)_column,&length);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&id);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&stack0xffffffffffffffdc);
    piVar2 = std::operator>>(piVar2,(char *)((long)&tempBlock.length + 3));
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    id_00 = tempBlock.direction;
    if (!bVar1) break;
    tempBlock.direction = tempBlock.direction + 1;
    Block::Block((Block *)local_54,id_00,length + -1,id + -1,iStack_24,tempBlock.length._3_1_);
    local_40 = (undefined1  [8])local_54._0_8_;
    tempBlock.id = local_54._8_4_;
    tempBlock.row = local_54._12_4_;
    tempBlock.column = local_44;
    std::vector<Block,_std::allocator<Block>_>::push_back(&this->blocks,(value_type *)local_40);
    block.column = tempBlock.id;
    block.length = tempBlock.row;
    block.id = local_40._0_4_;
    block.row = local_40._4_4_;
    block.direction = tempBlock.column;
    insert(this,block,-1);
  }
  return;
}

Assistant:

void Board::populateBoard(std::ifstream &dataFile) {
    int row, column, length;
    int id = 1;
    char direction;
    Block tempBlock;

    // Collect the other blocks.
    while (dataFile >> row >> column >> length >> direction) {
        // Construct a temporary block.
        tempBlock = Block(id++, row - 1, column - 1, length, direction);

        // Fill the cells storage variables.
        this->blocks.push_back(tempBlock);
        this->insert(tempBlock);
    }
}